

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

Token slang::parsing::Token::createMissing
                (BumpAllocator *alloc,TokenKind kind,SourceLocation location)

{
  ulong uVar1;
  Token *this;
  int iVar2;
  undefined6 in_register_00000032;
  Token TVar3;
  Token local_50;
  Token local_40;
  undefined8 local_30;
  char *pcStack_28;
  
  iVar2 = (int)CONCAT62(in_register_00000032,kind);
  if (0x156 < iVar2) {
    if ((iVar2 != 0x157) && (iVar2 != 0x159)) {
      if (iVar2 != 0x158) goto switchD_0020ab7a_default;
      goto switchD_0020ab7a_caseD_4;
    }
LAB_0020ac62:
    local_40.info = (Info *)0x0;
    local_40.rawLen = 0;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_50.info = (Info *)0x47e5a6;
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    init(&local_40,(EVP_PKEY_CTX *)alloc);
    *(undefined4 *)&local_40.info[1].rawTextPtr = 0;
    goto LAB_0020ae44;
  }
  switch(iVar2) {
  case 3:
    goto LAB_0020ac62;
  case 4:
switchD_0020ab7a_caseD_4:
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    local_50.info = (Info *)0x47e5a6;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_40.rawLen = 0;
    local_40.info = (Info *)0x0;
    init(&local_40,(EVP_PKEY_CTX *)alloc);
    local_40.info[1].rawTextPtr = (char *)0x0;
    local_40.info[1].location = (SourceLocation)((long)"{} union_data;\n\n" + 0x10);
    break;
  case 5:
    local_30 = 0;
    pcStack_28 = "";
    this = &local_50;
    Token(this,alloc,IntegerLiteral,
          (span<const_slang::parsing::Trivia,_18446744073709551615UL>)ZEXT816(0),
          (string_view)(ZEXT816(0x47e5a6) << 0x40),location,(SVInt *)SVInt::Zero);
    goto LAB_0020adac;
  case 6:
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    local_50.info = (Info *)0x47e5a6;
    this = &local_40;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_40.rawLen = 0;
    local_40.info = (Info *)0x0;
    init(this,(EVP_PKEY_CTX *)alloc);
    local_40._0_4_ = local_40._0_4_ | 0x2000000;
    goto LAB_0020adac;
  case 7:
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    local_50.info = (Info *)0x47e5a6;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_40.rawLen = 0;
    local_40.info = (Info *)0x0;
    init(&local_40,(EVP_PKEY_CTX *)alloc);
    *(undefined1 *)&local_40.info[1].rawTextPtr = 0x80;
    break;
  case 8:
    goto LAB_0020ae32;
  case 9:
LAB_0020ae32:
    local_40.info = (Info *)0x0;
    local_40.rawLen = 0;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_50.info = (Info *)0x47e5a6;
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    init(&local_40,(EVP_PKEY_CTX *)alloc);
    local_40.info[1].rawTextPtr = (char *)0x0;
    break;
  default:
switchD_0020ab7a_default:
    local_50.kind = Unknown;
    local_50._2_1_ = 0;
    local_50.numFlags.raw = '\0';
    local_50.rawLen = 0;
    local_50.info = (Info *)0x47e5a6;
    this = &local_40;
    local_40._0_4_ = local_40._0_4_ & 0xffffff;
    local_40.rawLen = 0;
    local_40.info = (Info *)0x0;
    init(this,(EVP_PKEY_CTX *)alloc);
LAB_0020adac:
    uVar1._0_2_ = this->kind;
    uVar1._2_1_ = this->field_0x2;
    uVar1._3_1_ = this->numFlags;
    uVar1._4_4_ = this->rawLen;
    local_40.info = this->info;
    goto LAB_0020ae47;
  }
LAB_0020ae44:
  uVar1 = CONCAT44(local_40.rawLen,local_40._0_4_);
LAB_0020ae47:
  TVar3._0_8_ = uVar1 | 0x10000;
  TVar3.info = local_40.info;
  return TVar3;
}

Assistant:

Token Token::createMissing(BumpAllocator& alloc, TokenKind kind, SourceLocation location) {
    Token result;
    switch (kind) {
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
            result = Token(alloc, kind, {}, "", location, "");
            break;
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
            result = Token(alloc, kind, {}, "", location, SyntaxKind::Unknown);
            break;
        case TokenKind::SystemIdentifier:
            result = Token(alloc, kind, {}, "", location, KnownSystemName::Unknown);
            break;
        case TokenKind::IntegerLiteral:
            result = Token(alloc, kind, {}, "", location, SVInt::Zero);
            break;
        case TokenKind::IntegerBase:
            result = Token(alloc, kind, {}, "", location, LiteralBase::Decimal, false);
            break;
        case TokenKind::UnbasedUnsizedLiteral:
            result = Token(alloc, kind, {}, "", location, logic_t::x);
            break;
        case TokenKind::RealLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, std::nullopt);
            break;
        case TokenKind::TimeLiteral:
            result = Token(alloc, kind, {}, "", location, 0.0, false, TimeUnit::Seconds);
            break;
        default:
            result = Token(alloc, kind, {}, "", location);
            break;
    }

    result.missing = true;
    return result;
}